

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConstructSymbolTableVisitor.cpp
# Opt level: O0

void __thiscall
CConstructSymbolTableVisitor::CConstructSymbolTableVisitor(CConstructSymbolTableVisitor *this)

{
  FullInfo *this_00;
  SymbolTable *this_01;
  shared_ptr<SymbolTable> local_40 [2];
  shared_ptr<FullInfo> local_20;
  CConstructSymbolTableVisitor *local_10;
  CConstructSymbolTableVisitor *this_local;
  
  local_10 = this;
  IVisitor::IVisitor((IVisitor *)this);
  (this->super_IVisitor)._vptr_IVisitor = (_func_int **)&PTR_Visit_002377f0;
  std::shared_ptr<SymbolTable>::shared_ptr(&this->table);
  std::shared_ptr<FullInfo>::shared_ptr(&this->info);
  std::vector<CError,_std::allocator<CError>_>::vector(&this->errors);
  this_00 = (FullInfo *)operator_new(0x80);
  (this_00->definedVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_00->definedVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)&this_00->field_0x60 = 0;
  *(undefined8 *)&this_00->field_0x68 = 0;
  *(undefined8 *)&this_00->iName = 0;
  *(undefined8 *)&this_00->field_0x58 = 0;
  (this_00->iType).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_00->iType).super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this_00->iVariable).super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_00->iVariable).super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this_00->iVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_00->iVariables).super___shared_ptr<VariablesInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this_00->iMethod).super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_00->iMethod).super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this_00->iClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_00->iClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  FullInfo::FullInfo(this_00);
  std::shared_ptr<FullInfo>::shared_ptr<FullInfo,void>(&local_20,this_00);
  std::shared_ptr<FullInfo>::operator=(&this->info,&local_20);
  std::shared_ptr<FullInfo>::~shared_ptr(&local_20);
  this_01 = (SymbolTable *)operator_new(0x38);
  *(undefined8 *)&(this_01->classes)._M_h._M_rehash_policy = 0;
  (this_01->classes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this_01->classes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this_01->classes)._M_h._M_element_count = 0;
  (this_01->classes)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this_01->classes)._M_h._M_bucket_count = 0;
  (this_01->classes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  SymbolTable::SymbolTable(this_01);
  std::shared_ptr<SymbolTable>::shared_ptr<SymbolTable,void>(local_40,this_01);
  std::shared_ptr<SymbolTable>::operator=(&this->table,local_40);
  std::shared_ptr<SymbolTable>::~shared_ptr(local_40);
  return;
}

Assistant:

CConstructSymbolTableVisitor::CConstructSymbolTableVisitor()
{
	info = std::shared_ptr<FullInfo>( new FullInfo() );
	table = std::shared_ptr<SymbolTable>( new SymbolTable() );
}